

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamInBinary * __thiscall chrono::ChStreamInBinary::operator>>(ChStreamInBinary *this,bool *Val)

{
  char tmp;
  
  (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,&tmp,1);
  *Val = tmp != '\0';
  return this;
}

Assistant:

ChStreamInBinary& ChStreamInBinary::operator>>(bool& Val) {
    // booleans as chars, for cross platform portability
    char tmp;
    this->Input((char*)&tmp, sizeof(char));
    if (tmp)
        Val = true;
    else
        Val = false;
    // Val = (bool)tmp;
    return (*this);
}